

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

Own<kj::_::AdapterPromiseNode<kj::Promise<void>,_kj::_::PromiseAndFulfillerAdapter<kj::Promise<void>_>_>,_kj::_::PromiseDisposer>
 __thiscall
kj::_::PromiseDisposer::
alloc<kj::_::AdapterPromiseNode<kj::Promise<void>,kj::_::PromiseAndFulfillerAdapter<kj::Promise<void>>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<kj::Promise<void>>&>
          (PromiseDisposer *this,WeakFulfiller<kj::Promise<void>_> *params)

{
  void *pvVar1;
  
  pvVar1 = operator_new(0x400);
  *(undefined8 *)((long)pvVar1 + 0x228) = 0;
  *(undefined8 *)((long)pvVar1 + 0x230) = 0;
  *(undefined ***)((long)pvVar1 + 0x220) = &PTR_destroy_006fbe28;
  *(undefined ***)((long)pvVar1 + 0x238) = &PTR_reject_006fbe78;
  *(undefined1 *)((long)pvVar1 + 0x240) = 0;
  *(undefined1 *)((long)pvVar1 + 0x3d8) = 0;
  *(undefined1 *)((long)pvVar1 + 1000) = 1;
  *(PromiseRejector **)((long)pvVar1 + 0x3f0) = (PromiseRejector *)((long)pvVar1 + 0x238);
  *(WeakFulfiller<kj::Promise<void>_> **)((long)pvVar1 + 0x3f8) = params;
  (params->super_WeakFulfillerBase).inner = (PromiseRejector *)((long)pvVar1 + 0x238);
  *(void **)((long)pvVar1 + 0x228) = pvVar1;
  *(long *)this = (long)pvVar1 + 0x220;
  return (Own<kj::_::AdapterPromiseNode<kj::Promise<void>,_kj::_::PromiseAndFulfillerAdapter<kj::Promise<void>_>_>,_kj::_::PromiseDisposer>
          )(AdapterPromiseNode<kj::Promise<void>,_kj::_::PromiseAndFulfillerAdapter<kj::Promise<void>_>_>
            *)this;
}

Assistant:

static kj::Own<T, D> alloc(Params&&... params) noexcept {
    // Implements allocPromise().
    T* ptr;
    if (!canArenaAllocate<T>()) {
      // Node too big (or needs weird alignment), fall back to regular heap allocation.
      ptr = new T(kj::fwd<Params>(params)...);
    } else {
      // Start a new arena.
      //
      // NOTE: As in appendPromise() (below), we don't implement exception-safety because it causes
      //   code bloat and these constructors probably don't throw. Instead this function is
      //   noexcept, so if a constructor does throw, it'll crash rather than leak memory.
      auto* arena = new PromiseArena;
      ptr = reinterpret_cast<T*>(arena + 1) - 1;
      ctor(*ptr, kj::fwd<Params>(params)...);
      ptr->arena = arena;
      KJ_IREQUIRE(reinterpret_cast<void*>(ptr) ==
                  reinterpret_cast<void*>(static_cast<PromiseArenaMember*>(ptr)),
          "PromiseArenaMember must be the leftmost inherited type.");
    }
    return kj::Own<T, D>(ptr);
  }